

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  uint uVar1;
  uint uVar2;
  FT_Memory memory;
  FT_Fixed *pFVar3;
  long lVar4;
  PS_Blend pPVar5;
  PS_FontInfo pPVar6;
  PS_Private pPVar7;
  FT_BBox *pFVar8;
  ulong uVar9;
  uint uVar10;
  FT_Error error;
  FT_Error local_3c;
  ulong local_38;
  
  memory = (face->root).memory;
  local_3c = 0;
  pPVar5 = face->blend;
  if (pPVar5 == (PS_Blend)0x0) {
    pPVar5 = (PS_Blend)ft_mem_alloc(memory,0x300,&local_3c);
    if (local_3c != 0) {
      return local_3c;
    }
    pPVar5->num_default_design_vector = 0;
    face->blend = pPVar5;
  }
  if (num_designs == 0) {
LAB_0017a9f6:
    if (num_axis != 0) {
      if (pPVar5->num_axis != 0 && pPVar5->num_axis != num_axis) goto LAB_0017aad0;
      pPVar5->num_axis = num_axis;
    }
    uVar1 = pPVar5->num_designs;
    uVar2 = pPVar5->num_axis;
    if ((uVar2 != 0 && (ulong)uVar1 != 0) && (pPVar5->design_pos[0] == (FT_Fixed *)0x0)) {
      pFVar3 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(uVar2 * uVar1),(void *)0x0,&local_3c);
      pPVar5->design_pos[0] = pFVar3;
      if ((local_3c == 0) && (1 < uVar1)) {
        lVar4 = 0;
        uVar10 = uVar2;
        do {
          pPVar5->design_pos[lVar4 + 1] = pPVar5->design_pos[0] + uVar10;
          lVar4 = lVar4 + 1;
          uVar10 = uVar10 + uVar2;
        } while ((ulong)uVar1 - 1 != lVar4);
      }
    }
  }
  else {
    if (pPVar5->num_designs == 0) {
      local_38 = (ulong)num_designs;
      pPVar6 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,local_38,(void *)0x0,&local_3c);
      pPVar5->font_infos[1] = pPVar6;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar7 = (PS_Private)ft_mem_realloc(memory,0xe0,0,local_38,(void *)0x0,&local_3c);
      pPVar5->privates[1] = pPVar7;
      if (local_3c != 0) {
        return local_3c;
      }
      pFVar8 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,local_38,(void *)0x0,&local_3c);
      pPVar5->bboxes[1] = pFVar8;
      if (local_3c != 0) {
        return local_3c;
      }
      pFVar3 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(num_designs * 2),(void *)0x0,&local_3c)
      ;
      pPVar5->weight_vector = pFVar3;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar5->default_weight_vector = pFVar3 + local_38;
      pPVar5->font_infos[0] = &(face->type1).font_info;
      pPVar5->privates[0] = &(face->type1).private_dict;
      pPVar5->bboxes[0] = &(face->type1).font_bbox;
      if (num_designs != 1) {
        uVar9 = 3;
        if (3 < num_designs + 1) {
          uVar9 = (ulong)(num_designs + 1);
        }
        pFVar8 = pPVar5->bboxes[1];
        lVar4 = 0;
        do {
          pFVar8 = pFVar8 + 1;
          pPVar5->font_infos[lVar4 + 2] = pPVar5->font_infos[lVar4 + 1] + 1;
          pPVar5->privates[lVar4 + 2] = pPVar5->privates[lVar4 + 1] + 1;
          pPVar5->bboxes[lVar4 + 2] = pFVar8;
          lVar4 = lVar4 + 1;
        } while (uVar9 - 2 != lVar4);
      }
      pPVar5->num_designs = num_designs;
      goto LAB_0017a9f6;
    }
    if (pPVar5->num_designs == num_designs) goto LAB_0017a9f6;
LAB_0017aad0:
    local_3c = 3;
  }
  return local_3c;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs     ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->weight_vector, num_designs * 2 ) )
          goto Exit;

        blend->default_weight_vector = blend->weight_vector + num_designs;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

    /* allocate the blend design pos table if needed */
    num_designs = blend->num_designs;
    num_axis    = blend->num_axis;
    if ( num_designs && num_axis && blend->design_pos[0] == 0 )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( blend->design_pos[0], num_designs * num_axis ) )
        goto Exit;

      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = blend->design_pos[0] + num_axis * n;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }